

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O3

void leb_MergeNodeConforming(leb_Heap *leb,leb_Node node,leb_DiamondParent diamond)

{
  uint *puVar1;
  uint uVar2;
  uint32_t *puVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  leb_Node lVar10;
  leb_Node node_00;
  leb_Node node_01;
  leb_Node node_02;
  uint uVar11;
  uint uVar12;
  long lVar13;
  
  lVar10 = diamond.top;
  uVar7 = node.depth;
  if (leb->minDepth != uVar7) {
    uVar12 = diamond.top.depth;
    if (diamond.top.id != uVar12) {
      lVar13 = ((ulong)lVar10 & 0xffffffff00000000) + 0x100000000;
      lVar10 = (leb_Node)((ulong)(diamond.top.id * 2) + lVar13 + 1);
      uVar12 = (uint)((ulong)lVar13 >> 0x20);
    }
    node_00.depth = 0;
    node_00.id = leb->maxDepth;
    uVar4 = leb__HeapRead((leb_Heap *)leb->buffer,node_00);
    node_01.depth = 0;
    node_01.id = leb->maxDepth;
    uVar5 = leb__HeapRead((leb_Heap *)leb->buffer,node_01);
    node_02.depth = 0;
    node_02.id = leb->maxDepth;
    uVar6 = leb__HeapRead((leb_Heap *)leb->buffer,node_02);
    if (((uVar4 == 1) && (uVar5 == 1)) && (uVar6 == 1)) {
      uVar2 = leb->maxDepth;
      uVar11 = (uint)(node.id != uVar7) | node.id;
      uVar9 = uVar7;
      if (uVar11 != uVar7) {
        uVar9 = uVar2;
      }
      bVar8 = (char)uVar2 - (char)node.depth;
      if (uVar11 == uVar7) {
        bVar8 = 0;
      }
      puVar3 = leb->buffer;
      uVar7 = ((uVar2 - uVar9) + 1) * (uVar11 << (bVar8 & 0x1f)) + (2 << ((byte)uVar9 & 0x1f));
      bVar8 = (byte)uVar7 & 0x1f;
      puVar1 = puVar3 + (uVar7 >> 5);
      *puVar1 = *puVar1 & (-2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8);
      uVar7 = leb->maxDepth;
      uVar9 = lVar10.id | (uint)(lVar10.id != uVar12);
      bVar8 = (char)uVar7 - (char)uVar12;
      uVar2 = uVar7;
      if (uVar12 == uVar9) {
        bVar8 = 0;
        uVar2 = uVar12;
      }
      uVar7 = ((uVar7 - uVar2) + 1) * (uVar9 << (bVar8 & 0x1f)) + (2 << ((byte)uVar2 & 0x1f));
      bVar8 = (byte)uVar7 & 0x1f;
      puVar1 = puVar3 + (uVar7 >> 5);
      *puVar1 = *puVar1 & (-2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8);
    }
  }
  return;
}

Assistant:

LEBDEF void
leb_MergeNodeConforming(
    leb_Heap *leb,
    const leb_Node node,
    const leb_DiamondParent diamond
) {
    if (!leb_IsRootNode(leb, node)) {
        leb_Node dualNode = leb__RightChildNode(diamond.top);
        bool b1 = leb_IsLeafNode(leb, leb__SiblingNode_Fast(node));
        bool b2 = leb_IsLeafNode(leb, dualNode);
        bool b3 = leb_IsLeafNode(leb, leb__SiblingNode(dualNode));

        if (b1 && b2 && b3) {
            leb__MergeNode(leb, node);
            leb__MergeNode(leb, dualNode);
        }
    }
}